

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5611.cpp
# Opt level: O3

bool __thiscall RTPressureMS5611::pressureInit(RTPressureMS5611 *this)

{
  RTIMUSettings *this_00;
  ulong uVar1;
  bool bVar2;
  uchar uVar3;
  ulong uVar4;
  uchar data [2];
  ushort local_2a;
  
  this_00 = (this->super_RTPressure).m_settings;
  uVar3 = this_00->m_I2CPressureAddress;
  this->m_pressureAddr = uVar3;
  bVar2 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,uVar3,0xa2,'\x02',(uchar *)&local_2a,
                            "Failed to read MS5611 calibration data");
  if (bVar2) {
    uVar3 = 0xa4;
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      this->m_calData[uVar4] = local_2a << 8 | local_2a >> 8;
      if (uVar4 == 5) {
        this->m_state = 0;
        return true;
      }
      bVar2 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,uVar3,'\x02',(uchar *)&local_2a,
                                "Failed to read MS5611 calibration data");
      uVar3 = uVar3 + '\x02';
      uVar1 = uVar4 + 1;
    } while (bVar2);
    bVar2 = 4 < uVar4;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RTPressureMS5611::pressureInit()
{
    unsigned char cmd = MS5611_CMD_PROM + 2;
    unsigned char data[2];

    m_pressureAddr = m_settings->m_I2CPressureAddress;

    // get calibration data

    for (int i = 0; i < 6; i++) {
        if (!m_settings->HALRead(m_pressureAddr, cmd, 2, data, "Failed to read MS5611 calibration data"))
            return false;
        m_calData[i] = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];
        // printf("Cal index: %d, data: %d\n", i, m_calData[i]);
        cmd += 2;
    }

    m_state = MS5611_STATE_IDLE;
    return true;
}